

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void ox_stack_delete(stack_s *self)

{
  if (self != (stack_s *)0x0) {
    if (self->array != (array_s *)0x0) {
      ox_array_delete(self->array);
      self->array = (array_s *)0x0;
    }
    self->element_num = 0;
    self->front = 0;
    self->num = 0;
    free(self);
    return;
  }
  return;
}

Assistant:

void 
ox_stack_delete(struct stack_s* self)
{
    if(self == NULL)
    {
        return;
    }

    if (self->array != NULL)
    {
        ox_array_delete(self->array);
        self->array = NULL;
    }

    self->element_num = 0;
    self->front = 0;
    self->num = 0;
    free(self);
    self = NULL;
}